

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

void Abc_NtkDfsBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsPi(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode(pNode);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjIsBox(pNode), iVar1 == 0)) {
      __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                    ,0x51,"void Abc_NtkDfsBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pNode_00 = Abc_ObjFaninReal(pNode,local_24);
        Abc_NtkDfsBoxes_rec(pNode_00,vNodes);
      }
      Vec_PtrPush(vNodes,pNode);
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin of the node
    Abc_ObjForEachFaninReal( pNode, pFanin, i )
        Abc_NtkDfsBoxes_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}